

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O0

void __thiscall Clasp::Cli::JsonOutput::printKeyValue(JsonOutput *this,char *k,StatisticObject *o)

{
  bool bVar1;
  StatisticObject *in_RSI;
  char *in_RDI;
  double dVar2;
  JsonOutput *unaff_retaddr;
  double v;
  char *k_00;
  
  k_00 = in_RDI;
  dVar2 = StatisticObject::value(in_RSI);
  printKey(unaff_retaddr,k_00);
  bVar1 = isNan(6.88706265479927e-318);
  if (bVar1) {
    printf("%s","null");
  }
  else {
    printf("%g",dVar2);
  }
  *(char **)(in_RDI + 0x38) = ",\n";
  return;
}

Assistant:

void JsonOutput::printKeyValue(const char* k, const StatisticObject& o) {
	double v = o.value();
	printKey(k);
	if (!isNan(v)) { printf("%g", v); }
	else           { printf("%s", "null"); }
	open_ = ",\n";
}